

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

void coda_strfl(double a,char *s)

{
  if (((ulong)a & 0xfffffffffffff) != 0 && (~(ulong)a & 0x7ff0000000000000) == 0) {
    builtin_strncpy(s,"nan",4);
    return;
  }
  if (a < INFINITY) {
    if (-INFINITY < a) {
      sprintf(s,"%.16g");
      return;
    }
    builtin_strncpy(s,"-inf",5);
    return;
  }
  builtin_strncpy(s,"+inf",5);
  return;
}

Assistant:

LIBCODA_API void coda_strfl(double a, char *s)
{
    if (coda_isNaN(a))
    {
        strcpy(s, "nan");
    }
    else if (coda_isPlusInf(a))
    {
        strcpy(s, "+inf");
    }
    else if (coda_isMinInf(a))
    {
        strcpy(s, "-inf");
    }
    else
    {
        sprintf(s, "%.16g", a);
    }
}